

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void * sqlite3Fts3HashInsert(Fts3Hash *pH,void *pKey,int nKey,void *data)

{
  _fts3ht *p_Var1;
  Fts3HashElem *pFVar2;
  Fts3HashElem *pFVar3;
  int iVar4;
  int iVar5;
  Fts3HashElem *pFVar6;
  void *pvVar7;
  code *pcVar8;
  Fts3HashElem *pFVar9;
  ulong uVar10;
  
  pcVar8 = fts3BinHash;
  if (pH->keyClass == '\x01') {
    pcVar8 = fts3StrHash;
  }
  iVar4 = (*pcVar8)(pKey,nKey);
  uVar10 = (long)pH->htsize - 1U & (long)iVar4;
  pFVar6 = fts3FindElementByHash(pH,pKey,nKey,(int)uVar10);
  if (pFVar6 != (Fts3HashElem *)0x0) {
    pvVar7 = pFVar6->data;
    if (data != (void *)0x0) {
      pFVar6->data = data;
      return pvVar7;
    }
    pFVar2 = pFVar6->next;
    pFVar3 = pFVar6->prev;
    pFVar9 = (Fts3HashElem *)&pH->first;
    if (pFVar3 != (Fts3HashElem *)0x0) {
      pFVar9 = pFVar3;
    }
    pFVar9->next = pFVar2;
    if (pFVar2 != (Fts3HashElem *)0x0) {
      pFVar2->prev = pFVar3;
    }
    p_Var1 = pH->ht + uVar10;
    if (pH->ht[uVar10].chain == pFVar6) {
      p_Var1->chain = pFVar2;
    }
    iVar4 = p_Var1->count;
    p_Var1->count = iVar4 + -1;
    if (iVar4 < 2) {
      p_Var1->chain = (Fts3HashElem *)0x0;
    }
    if ((pH->copyKey != '\0') && (pFVar6->pKey != (void *)0x0)) {
      sqlite3_free(pFVar6->pKey);
    }
    sqlite3_free(pFVar6);
    iVar4 = pH->count;
    pH->count = iVar4 + -1;
    if (1 < iVar4) {
      return pvVar7;
    }
    sqlite3Fts3HashClear(pH);
    return pvVar7;
  }
  if (data != (void *)0x0) {
    iVar5 = pH->htsize;
    if (iVar5 == 0) {
      iVar5 = fts3Rehash(pH,8);
      if (iVar5 != 0) goto LAB_001b377b;
      iVar5 = pH->htsize;
    }
    if ((iVar5 <= pH->count) && (iVar5 = fts3Rehash(pH,iVar5 * 2), iVar5 != 0)) {
LAB_001b377b:
      pH->count = 0;
      return data;
    }
    pFVar6 = (Fts3HashElem *)fts3HashMalloc(0x28);
    if (pFVar6 == (Fts3HashElem *)0x0) {
      return data;
    }
    if ((pKey == (void *)0x0) || (pH->copyKey == '\0')) {
      pFVar6->pKey = pKey;
    }
    else {
      pvVar7 = fts3HashMalloc((long)nKey);
      pFVar6->pKey = pvVar7;
      if (pvVar7 == (void *)0x0) {
        sqlite3_free(pFVar6);
        return data;
      }
      memcpy(pvVar7,pKey,(long)nKey);
    }
    pFVar6->nKey = nKey;
    pH->count = pH->count + 1;
    fts3HashInsertElement(pH,pH->ht + ((long)pH->htsize - 1U & (long)iVar4),pFVar6);
    pFVar6->data = data;
  }
  return (void *)0x0;
}

Assistant:

SQLITE_PRIVATE void *sqlite3Fts3HashInsert(
  Fts3Hash *pH,        /* The hash table to insert into */
  const void *pKey,    /* The key */
  int nKey,            /* Number of bytes in the key */
  void *data           /* The data */
){
  int hraw;                 /* Raw hash value of the key */
  int h;                    /* the hash of the key modulo hash table size */
  Fts3HashElem *elem;       /* Used to loop thru the element list */
  Fts3HashElem *new_elem;   /* New element added to the pH */
  int (*xHash)(const void*,int);  /* The hash function */

  assert( pH!=0 );
  xHash = ftsHashFunction(pH->keyClass);
  assert( xHash!=0 );
  hraw = (*xHash)(pKey, nKey);
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  elem = fts3FindElementByHash(pH,pKey,nKey,h);
  if( elem ){
    void *old_data = elem->data;
    if( data==0 ){
      fts3RemoveElementByHash(pH,elem,h);
    }else{
      elem->data = data;
    }
    return old_data;
  }
  if( data==0 ) return 0;
  if( (pH->htsize==0 && fts3Rehash(pH,8))
   || (pH->count>=pH->htsize && fts3Rehash(pH, pH->htsize*2))
  ){
    pH->count = 0;
    return data;
  }
  assert( pH->htsize>0 );
  new_elem = (Fts3HashElem*)fts3HashMalloc( sizeof(Fts3HashElem) );
  if( new_elem==0 ) return data;
  if( pH->copyKey && pKey!=0 ){
    new_elem->pKey = fts3HashMalloc( nKey );
    if( new_elem->pKey==0 ){
      fts3HashFree(new_elem);
      return data;
    }
    memcpy((void*)new_elem->pKey, pKey, nKey);
  }else{
    new_elem->pKey = (void*)pKey;
  }
  new_elem->nKey = nKey;
  pH->count++;
  assert( pH->htsize>0 );
  assert( (pH->htsize & (pH->htsize-1))==0 );
  h = hraw & (pH->htsize-1);
  fts3HashInsertElement(pH, &pH->ht[h], new_elem);
  new_elem->data = data;
  return 0;
}